

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

Color * __thiscall
Scene::trace(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Ray *ray)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  double dVar3;
  int iVar4;
  undefined4 extraout_var;
  double t;
  Color local_88;
  Vector local_68;
  undefined1 local_48 [16];
  double local_38;
  
  level = level + 1;
  Stats::totalRays = Stats::totalRays + 1;
  iVar4 = (*this->_vptr_Scene[2])(this,ray);
  if ((GeometricObject *)CONCAT44(extraout_var,iVar4) == (GeometricObject *)0x0) {
    (*this->_vptr_Scene[3])(&local_88,this,ray);
    __return_storage_ptr__->x = local_88.x;
    __return_storage_ptr__->y = local_88.y;
    __return_storage_ptr__->z = local_88.z;
  }
  else {
    local_68.z = (ray->dir).z;
    local_38 = local_68.z * 30000.0 + (ray->org).z;
    local_68.x = (ray->dir).x;
    local_68.y = (ray->dir).y;
    dVar3 = local_68.y * 30000.0 + (ray->org).y;
    local_48._8_4_ = SUB84(dVar3,0);
    local_48._0_8_ = local_68.x * 30000.0 + (ray->org).x;
    local_48._12_4_ = (int)((ulong)dVar3 >> 0x20);
    shade(&local_88,this,curMed,weight,(Vector *)local_48,&local_68,
          (GeometricObject *)CONCAT44(extraout_var,iVar4));
    __return_storage_ptr__->x = local_88.x;
    __return_storage_ptr__->y = local_88.y;
    __return_storage_ptr__->z = local_88.z;
    if (threshold < curMed->beta) {
      dVar3 = exp(curMed->beta * -30000.0);
      auVar2._8_4_ = SUB84(dVar3 * local_88.y,0);
      auVar2._0_8_ = dVar3 * local_88.x;
      auVar2._12_4_ = (int)((ulong)(dVar3 * local_88.y) >> 0x20);
      __return_storage_ptr__->x = dVar3 * local_88.x;
      __return_storage_ptr__->y = (double)auVar2._8_8_;
      __return_storage_ptr__->z = local_88.z * dVar3;
    }
  }
  peVar1 = (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(code *)**(undefined8 **)peVar1)(0,peVar1,__return_storage_ptr__);
  }
  level = level + -1;
  return __return_storage_ptr__;
}

Assistant:

Color Scene::trace(Grayzer::Medium& curMed, double weight, Ray& ray)
{
   GeometricObject *obj;
   double t = GEOM_INFINITY;
   Color color;

   level++;
   Stats::raysCast();

   if((obj = intersect(ray,t)) != 0)
   {
      color = shade(curMed, weight, ray.point(t), ray.dir, obj);
      if(curMed.beta > threshold) color *= exp(-t * curMed.beta);
   }
   else
      color = shade_background(ray);
   //
   // added fog
   //
   if (envFog) envFog->shade(color, t);

   level--;
   return color;
}